

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  CacheEntryType CVar9;
  pointer pbVar10;
  long lVar11;
  string *psVar12;
  long lVar13;
  mapped_type *pmVar14;
  ostream *poVar15;
  ulong uVar16;
  mapped_type mVar17;
  size_type sVar18;
  _Alloc_hider _Var19;
  string *ck;
  string *key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uint uVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  string entryPattern;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string path;
  bool local_199;
  ulong local_198;
  undefined1 local_188 [40];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *local_160;
  string local_158;
  CacheEntryType local_134;
  undefined1 local_130 [17];
  undefined7 uStack_11f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  cmake *local_108;
  undefined1 local_100 [80];
  char *local_b0;
  char *local_60;
  char *local_40;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = true;
  local_199 = 0x20 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10);
  if (local_199) {
    local_160 = &this->DiagLevels;
    bVar2 = 0;
    local_198 = 1;
    local_110 = args;
    local_108 = this;
    do {
      paVar20 = &local_158.field_2;
      pbVar10 = pbVar10 + local_198;
      lVar11 = std::__cxx11::string::find((char *)pbVar10,0x5345ba,0);
      iVar8 = (int)local_198;
      if (lVar11 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar10);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          local_198 = (ulong)(iVar8 + 1);
          if (local_198 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_00278bf6;
          }
          bVar5 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_00278bf6:
          local_158._M_string_length = 0;
          local_158.field_2._M_local_buf[0] = '\0';
          local_188._0_8_ = local_188 + 0x10;
          local_188._8_8_ = (string *)0x0;
          local_188._16_8_ = local_188._16_8_ & 0xffffffffffffff00;
          local_134 = UNINITIALIZED;
          local_158._M_dataplus._M_p = (pointer)paVar20;
          bVar5 = cmState::ParseCacheEntry
                            ((string *)local_100,&local_158,(string *)local_188,&local_134);
          if (bVar5) {
            local_130._0_8_ = local_130 + 0x10;
            local_130._8_8_ = (string *)0x0;
            local_130[0x10] = 0;
            if (this->WarnUnusedCli == true) {
              psVar12 = cmState::GetInitializedCacheValue(this->State,&local_158);
              bVar6 = psVar12 != (string *)0x0;
              if (bVar6) {
                bVar6 = true;
                std::__cxx11::string::_M_assign((string *)local_130);
              }
            }
            else {
              bVar6 = false;
            }
            AddCacheEntry(this,&local_158,(char *)local_188._0_8_,
                          "No help, variable specified on the command line.",local_134);
            if ((this->WarnUnusedCli == true) &&
               (((!bVar6 ||
                 (psVar12 = cmState::GetInitializedCacheValue(this->State,&local_158),
                 (string *)local_130._8_8_ != (string *)psVar12->_M_string_length)) ||
                (((string *)local_130._8_8_ != (string *)0x0 &&
                 (iVar8 = bcmp((void *)local_130._0_8_,(psVar12->_M_dataplus)._M_p,local_130._8_8_),
                 iVar8 != 0)))))) {
              WatchUnusedCli(this,&local_158);
            }
            if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,CONCAT71(uStack_11f,local_130[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar10->_M_dataplus)._M_p,
                                 pbVar10->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_188._0_8_ != (string *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar20) {
            operator_delete(local_158._M_dataplus._M_p,
                            CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                     local_158.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        args = local_110;
        if (bVar5 == false) {
          bVar5 = false;
        }
        else {
LAB_00279433:
          bVar5 = true;
        }
      }
      else {
        iVar7 = strncmp((pbVar10->_M_dataplus)._M_p,"-W",2);
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar10);
          if ((char *)local_100._8_8_ == (char *)0x0) {
            local_198 = (ulong)(iVar8 + 1);
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_198) {
              bVar5 = false;
              cmSystemTools::Error
                        ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0
                        );
              goto LAB_00279344;
            }
            std::__cxx11::string::_M_assign((string *)local_100);
          }
          local_158._M_string_length = 0;
          local_158.field_2._M_local_buf[0] = '\0';
          local_158._M_dataplus._M_p = (pointer)paVar20;
          lVar11 = std::__cxx11::string::find(local_100,0x54dff8,0);
          lVar13 = std::__cxx11::string::find(local_100,0x54dffc,(ulong)((uint)(lVar11 == 0) * 3));
          std::__cxx11::string::substr((ulong)local_188,(ulong)local_100);
          std::__cxx11::string::operator=((string *)&local_158,(string *)local_188);
          if ((string *)local_188._0_8_ != (string *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
          }
          this = local_108;
          bVar5 = local_158._M_string_length != 0;
          if (local_158._M_string_length == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar11 == 0 || lVar13 == 0) {
            if (lVar11 == 0 && lVar13 != 0) {
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_160,&local_158);
              *pmVar14 = DIAG_IGNORE;
            }
            else {
              if ((lVar11 == 0) || (lVar13 != 0)) {
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_160,&local_158);
                mVar17 = *pmVar14;
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](local_160,&local_158);
                if (0 < (int)mVar17) {
                  mVar17 = DIAG_WARN;
                }
                goto LAB_0027905f;
              }
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](local_160,&local_158);
              *pmVar14 = DIAG_ERROR;
            }
          }
          else {
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_160,&local_158);
            mVar17 = *pmVar14;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                      ::operator[](local_160,&local_158);
            if ((int)mVar17 < 2) {
              mVar17 = DIAG_WARN;
            }
LAB_0027905f:
            *pmVar14 = mVar17;
          }
          args = local_110;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,
                            CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                     local_158.field_2._M_local_buf[0]) + 1);
            args = local_110;
          }
LAB_00279344:
          sVar18 = local_100._16_8_;
          _Var19._M_p = (pointer)local_100._0_8_;
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_00279361:
            operator_delete(_Var19._M_p,sVar18 + 1);
          }
LAB_00279369:
          uVar21 = (uint)local_198;
          if (bVar5) goto LAB_00279433;
        }
        else {
          lVar11 = std::__cxx11::string::find((char *)pbVar10,0x534414,0);
          if (lVar11 == 0) {
            std::__cxx11::string::substr((ulong)&local_158,(ulong)pbVar10);
            if (local_158._M_string_length == 0) {
              local_198 = (ulong)(iVar8 + 1);
              if (local_198 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&local_158);
                goto LAB_0027911d;
              }
              bVar5 = false;
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_0027911d:
              cmsys::Glob::PatternToRegex((string *)local_188,&local_158,true,true);
              local_100._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_b0 = (char *)0x0;
              local_60 = (char *)0x0;
              local_40 = (char *)0x0;
              if ((string *)local_188._0_8_ != (string *)0x0) {
                cmsys::RegularExpression::compile
                          ((RegularExpression *)local_100,(char *)local_188._0_8_);
              }
              if ((string *)local_188._0_8_ != (string *)(local_188 + 0x10)) {
                operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
              }
              local_188._0_8_ = (string *)0x0;
              local_188._8_8_ = (string *)0x0;
              local_188._16_8_ = 0;
              cmState::GetCacheEntryKeys_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_130,this->State);
              uVar4 = local_130._8_8_;
              for (psVar12 = (string *)local_130._0_8_; uVar3 = local_188._8_8_,
                  key = (string *)local_188._0_8_, psVar12 != (string *)uVar4; psVar12 = psVar12 + 1
                  ) {
                CVar9 = cmState::GetCacheEntryType(this->State,psVar12);
                if ((CVar9 != STATIC) &&
                   (bVar5 = cmsys::RegularExpression::find
                                      ((RegularExpression *)local_100,(psVar12->_M_dataplus)._M_p,
                                       (RegularExpressionMatch *)local_100), bVar5)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_188,psVar12);
                }
              }
              for (; key != (string *)uVar3; key = key + 1) {
                cmState::RemoveCacheEntry(this->State,key);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_130);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_188);
              if (local_40 != (char *)0x0) {
                operator_delete__(local_40);
              }
              bVar5 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar20) {
              sVar18 = CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                local_158.field_2._M_local_buf[0]);
              _Var19._M_p = local_158._M_dataplus._M_p;
              goto LAB_00279361;
            }
            goto LAB_00279369;
          }
          lVar11 = std::__cxx11::string::find((char *)pbVar10,0x53429c,0);
          if (lVar11 == 0) {
            std::__cxx11::string::substr((ulong)local_100,(ulong)pbVar10);
            if ((char *)local_100._8_8_ == (char *)0x0) {
              local_198 = (ulong)(iVar8 + 1);
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_198) {
                bVar5 = false;
                cmSystemTools::Error
                          ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                goto LAB_00279344;
              }
              std::__cxx11::string::_M_assign((string *)local_100);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"loading initial cache file ",0x1b);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            bVar5 = true;
            ReadListFile(this,args,(string *)local_100);
            goto LAB_00279344;
          }
          lVar11 = std::__cxx11::string::find((char *)pbVar10,0x541760,0);
          if (lVar11 != 0) {
            lVar11 = std::__cxx11::string::find((char *)pbVar10,0x54e09f,0);
            if (lVar11 == 0) {
              bVar2 = 1;
            }
            goto LAB_00279433;
          }
          uVar21 = iVar8 + 1;
          local_198 = (ulong)uVar21;
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5) <=
              local_198) {
            bVar5 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            local_198._0_4_ = uVar21;
            goto LAB_00279436;
          }
          local_100._0_8_ = local_100 + 0x10;
          pcVar1 = pbVar10[local_198]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,pcVar1,pcVar1 + pbVar10[local_198]._M_string_length);
          uVar4 = local_100._8_8_;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            GetProjectCommandsInScriptMode(this->State);
            ReadListFile(this,args,(string *)local_100);
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          if ((char *)uVar4 != (char *)0x0) goto LAB_00279433;
        }
        local_198._0_4_ = uVar21;
        bVar5 = false;
      }
LAB_00279436:
      if (!bVar5) break;
      local_198 = (ulong)((uint)local_198 + 1);
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
      local_199 = local_198 < uVar16;
    } while (local_198 < uVar16);
    bVar5 = (bool)(bVar2 ^ 1);
  }
  bVar6 = (bool)(local_199 ^ 1);
  if ((local_199 == false) && (!bVar5)) {
    bVar6 = FindPackage(this,args);
  }
  return bVar6;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-D", 0) == 0) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
        }
      }
      std::string var, value;
      cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
      if (cmState::ParseCacheEntry(entry, var, value, type)) {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if (this->WarnUnusedCli) {
          if (const std::string* v =
                this->State->GetInitializedCacheValue(var)) {
            haveValue = true;
            cachedValue = *v;
          }
        }

        this->AddCacheEntry(var, value.c_str(),
                            "No help, variable specified on the command line.",
                            type);

        if (this->WarnUnusedCli) {
          if (!haveValue ||
              cachedValue != *this->State->GetInitializedCacheValue(var)) {
            this->WatchUnusedCli(var);
          }
        }
      } else {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
    } else if (cmHasLiteralPrefix(arg, "-W")) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
        }
      }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0) {
        foundNo = true;
        nameStartPosition += 3;
      }

      if (entry.find("error=", nameStartPosition) == 0) {
        foundError = true;
        nameStartPosition += 6;
      }

      name = entry.substr(nameStartPosition);
      if (name.empty()) {
        cmSystemTools::Error("No warning name provided.");
        return false;
      }

      if (!foundNo && !foundError) {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
      } else if (foundNo && !foundError) {
        // -Wno<name>
        this->DiagLevels[name] = DIAG_IGNORE;
      } else if (!foundNo && foundError) {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
      } else {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
      }
    } else if (arg.find("-U", 0) == 0) {
      std::string entryPattern = arg.substr(2);
      if (entryPattern.empty()) {
        ++i;
        if (i < args.size()) {
          entryPattern = args[i];
        } else {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
        }
      }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      // go through all cache entries and collect the vars which will be
      // removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::string const& ck : cacheKeys) {
        cmStateEnums::CacheEntryType t = this->State->GetCacheEntryType(ck);
        if (t != cmStateEnums::STATIC) {
          if (regex.find(ck)) {
            entriesToDelete.push_back(ck);
          }
        }
      }

      // now remove them from the cache
      for (std::string const& currentEntry : entriesToDelete) {
        this->State->RemoveCacheEntry(currentEntry);
      }
    } else if (arg.find("-C", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i < args.size()) {
          path = args[i];
        } else {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
        }
      }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path);
    } else if (arg.find("-P", 0) == 0) {
      i++;
      if (i >= args.size()) {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
      }
      std::string path = args[i];
      if (path.empty()) {
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
      // Register fake project commands that hint misuse in script mode.
      GetProjectCommandsInScriptMode(this->State);
      this->ReadListFile(args, path);
    } else if (arg.find("--find-package", 0) == 0) {
      findPackageMode = true;
    }
  }

  if (findPackageMode) {
    return this->FindPackage(args);
  }

  return true;
}